

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

void __thiscall E64::core_t::do_sound_and_timers(core_t *this,uint32_t cycles)

{
  int iVar1;
  clock_t cVar2;
  char *pcVar3;
  uint32_t number_of_cycles;
  bool bVar4;
  
  number_of_cycles = cycles;
  if (this->current_mode == RUN) {
    number_of_cycles = 0;
    while (bVar4 = cycles != 0, cycles = cycles - 1, bVar4) {
      cVar2 = timer_t::clock((timer_t *)&this->field_0x88);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer0_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0xa0);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer1_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0xb8);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer2_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0xd0);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer3_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0xe8);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer4_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0x100);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer5_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0x118);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer6_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      cVar2 = timer_t::clock((timer_t *)&this->field_0x130);
      if ((char)cVar2 != '\0') {
        sound_ic::run(this->sound,number_of_cycles,this->host);
        lua_getglobal(this->L,"timer7_callback");
        number_of_cycles = 0;
        iVar1 = lua_pcallk(this->L,0,0,0,0,(lua_KFunction)0x0);
        if (iVar1 != 0) {
          number_of_cycles = 0;
          pcVar3 = lua_tolstring(this->L,-1,(size_t *)0x0);
          printf("[core] Lua error: %s",pcVar3);
        }
      }
      number_of_cycles = number_of_cycles + 1;
    }
  }
  sound_ic::run(this->sound,number_of_cycles,this->host);
  return;
}

Assistant:

void E64::core_t::do_sound_and_timers(uint32_t cycles)
{
	uint32_t cycles_done = 0;
	
	if (current_mode == RUN) {
		while (cycles--) {
			if (timer[0].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer0_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[1].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer1_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[2].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer2_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[3].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer3_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[4].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer4_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[5].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer5_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[6].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer6_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			if (timer[7].clock()) {
				sound->run(cycles_done, host);
				cycles_done = 0;
				lua_getglobal(L, "timer7_callback");
				if (lua_pcall(L, 0, 0, 0)) {
					printf("[core] Lua error: %s", lua_tostring(L, -1));
				}
			}
			cycles_done++;
		}
	} else {
		cycles_done = cycles;
	}
	
	sound->run(cycles_done, host);
}